

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

uint __thiscall
xercesc_4_0::WFElemStack::mapPrefixToURI(WFElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  *unknown = false;
  uVar2 = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  if (uVar2 == 0) {
LAB_002a4dc1:
    *unknown = true;
    this = (WFElemStack *)&this->fUnknownNamespaceId;
  }
  else if (uVar2 == this->fXMLPoolId) {
    this = (WFElemStack *)&this->fXMLNamespaceId;
  }
  else if (uVar2 == this->fXMLNSPoolId) {
    this = (WFElemStack *)&this->fXMLNSNamespaceId;
  }
  else {
    uVar1 = this->fStack[this->fStackTop - 1]->fTopPrefix;
    do {
      uVar3 = uVar1;
      if ((int)uVar3 < 0) {
        if (*prefixToMap != L'\0') goto LAB_002a4dc1;
        goto LAB_002a4dc9;
      }
      uVar1 = uVar3 - 1;
    } while (this->fMap[uVar3].fPrefId != uVar2);
    this = (WFElemStack *)&this->fMap[uVar3].fURIId;
  }
LAB_002a4dc9:
  return this->fEmptyNamespaceId;
}

Assistant:

unsigned int WFElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                          ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);
    if (!prefixId)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }

    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    //  Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];
    for (int mapIndex = curRow->fTopPrefix; mapIndex >=0; mapIndex--)
    {
        if (fMap[mapIndex].fPrefId == prefixId)
            return fMap[mapIndex].fURIId;
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}